

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_bool32 drwav__on_seek_memory(void *pUserData,int offset,drwav_seek_origin origin)

{
  ulong uVar1;
  long lVar2;
  
  if (origin == drwav_seek_origin_current) {
    uVar1 = *(ulong *)((long)pUserData + 0xf0);
    if (offset < 1) {
      if (uVar1 < (uint)-offset) {
        return 0;
      }
    }
    else if (*(ulong *)((long)pUserData + 0xe8) < (uint)offset + uVar1) {
      return 0;
    }
    lVar2 = uVar1 + (long)offset;
  }
  else {
    if (*(ulong *)((long)pUserData + 0xe8) < (ulong)(uint)offset) {
      return 0;
    }
    lVar2 = (long)offset;
  }
  *(long *)((long)pUserData + 0xf0) = lVar2;
  return 1;
}

Assistant:

static drwav_bool32 drwav__on_seek_memory(void* pUserData, int offset, drwav_seek_origin origin)
{
    drwav* pWav = (drwav*)pUserData;
    DRWAV_ASSERT(pWav != NULL);

    if (origin == drwav_seek_origin_current) {
        if (offset > 0) {
            if (pWav->memoryStream.currentReadPos + offset > pWav->memoryStream.dataSize) {
                return DRWAV_FALSE; /* Trying to seek too far forward. */
            }
        } else {
            if (pWav->memoryStream.currentReadPos < (size_t)-offset) {
                return DRWAV_FALSE; /* Trying to seek too far backwards. */
            }
        }

        /* This will never underflow thanks to the clamps above. */
        pWav->memoryStream.currentReadPos += offset;
    } else {
        if ((drwav_uint32)offset <= pWav->memoryStream.dataSize) {
            pWav->memoryStream.currentReadPos = offset;
        } else {
            return DRWAV_FALSE; /* Trying to seek too far forward. */
        }
    }
    
    return DRWAV_TRUE;
}